

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

htmlDocPtr htmlCtxtReadDoc(htmlParserCtxtPtr ctxt,xmlChar *cur,char *URL,char *encoding,int options)

{
  xmlParserInputPtr value;
  htmlDocPtr pxVar1;
  
  if (ctxt != (htmlParserCtxtPtr)0x0 && cur != (xmlChar *)0x0) {
    xmlInitParser();
    htmlCtxtReset(ctxt);
    value = xmlNewStringInputStream(ctxt,cur);
    if (value != (xmlParserInputPtr)0x0) {
      inputPush(ctxt,value);
      pxVar1 = htmlDoRead(ctxt,URL,encoding,options,1);
      return pxVar1;
    }
  }
  return (htmlDocPtr)0x0;
}

Assistant:

htmlDocPtr
htmlCtxtReadDoc(htmlParserCtxtPtr ctxt, const xmlChar * cur,
               const char *URL, const char *encoding, int options)
{
    xmlParserInputPtr stream;

    if (cur == NULL)
        return (NULL);
    if (ctxt == NULL)
        return (NULL);
    xmlInitParser();

    htmlCtxtReset(ctxt);

    stream = xmlNewStringInputStream(ctxt, cur);
    if (stream == NULL) {
        return (NULL);
    }
    inputPush(ctxt, stream);
    return (htmlDoRead(ctxt, URL, encoding, options, 1));
}